

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_lengthi<char,char32_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *extraout_RDX;
  char *pcVar5;
  char *pcVar6;
  jessilib *this;
  size_t sVar7;
  decode_result dVar8;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar6 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar2 = (char *)in_prefix._M_len;
  pcVar5 = (char *)0x0;
  sVar7 = 0;
  pcVar3 = pcVar2;
  while( true ) {
    if ((this == (jessilib *)0x0) || (pcVar2 == pcVar5)) {
      sVar4 = 0;
      if (pcVar2 == pcVar5) {
        sVar4 = sVar7;
      }
      return sVar4;
    }
    in_string_00._M_str = pcVar3;
    in_string_00._M_len = (size_t)pcVar6;
    dVar8 = decode_codepoint_utf8<char>(this,in_string_00);
    sVar4 = dVar8.units;
    if ((sVar4 == 0) || (bVar1 = equalsi(dVar8.codepoint,in_prefix._M_str[(long)pcVar5]), !bVar1))
    break;
    pcVar6 = pcVar6 + sVar4;
    this = this + -sVar4;
    sVar7 = sVar7 + sVar4;
    pcVar5 = pcVar5 + 1;
    pcVar3 = extraout_RDX;
  }
  return 0;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}